

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void DoIt(bool allIntensityBinsCheck)

{
  ValidateVulnerability vV;
  
  vV.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vV.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header;
  vV.super_Validate.lineno_ = 1;
  vV.super_Validate.warnings_ = false;
  vV._vptr_ValidateVulnerability = (_func_int **)&PTR_WriteBinVulnerabilityFile_00106d60;
  vV.convertToBin_ = false;
  vV.useIndexFile_ = false;
  vV.prevVulID_ = 0;
  builtin_strncpy(vV.vulIDName_,"Vulnerability",0xe);
  vV.prevDamageBinID_ = 0;
  vV.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vV.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vV.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vV.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vV.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header;
  vV.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vV.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vV.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  builtin_strncpy(vV.super_Validate.fileDescription_ + 8,"ility",6);
  builtin_strncpy(vV.super_Validate.fileDescription_,"Vulnerab",8);
  vV.super_Validate.MIN_ID_ = vV.super_Validate.lineno_;
  vV.allIntensityBinsCheck_ = allIntensityBinsCheck;
  vV.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vV.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  vV.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vV.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Validate::SkipHeaderRow(&vV.super_Validate);
  ValidateVulnerability::ReadVulnerabilityFile(&vV);
  ValidateVulnerability::PrintMaximumDamageBinIndex(&vV);
  Validate::PrintSuccessMessage(&vV.super_Validate);
  ValidateVulnerability::~ValidateVulnerability(&vV);
  return;
}

Assistant:

void DoIt(const bool allIntensityBinsCheck) {

  ValidateVulnerability vV(allIntensityBinsCheck);
  vV.SkipHeaderRow();
  vV.ReadVulnerabilityFile();
  vV.PrintMaximumDamageBinIndex();
  vV.PrintSuccessMessage();

}